

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardplural.cpp
# Opt level: O1

int32_t icu_63::StandardPlural::indexFromString(UnicodeString *keyword,UErrorCode *errorCode)

{
  int32_t iVar1;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 5;
  }
  iVar1 = indexOrNegativeFromString(keyword);
  if (iVar1 < 0) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    iVar1 = 5;
  }
  return iVar1;
}

Assistant:

int32_t StandardPlural::indexFromString(const UnicodeString &keyword, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return OTHER; }
    int32_t i = indexOrNegativeFromString(keyword);
    if (i >= 0) {
        return i;
    } else {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return OTHER;
    }
}